

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void apu_synchronize(Emulator *e)

{
  u32 local_14;
  u32 ticks;
  Emulator *e_local;
  
  if ((e->state).apu.sync_ticks < (e->state).ticks) {
    local_14 = (int)(e->state).ticks - (int)(e->state).apu.sync_ticks;
    if ((e->state).apu.enabled == FALSE) {
      for (; local_14 != 0; local_14 = local_14 - 2) {
        write_audio_frame(e,1);
      }
      (e->state).apu.sync_ticks = (e->state).ticks;
    }
    else {
      apu_update(e,local_14);
      if ((e->state).apu.sync_ticks != (e->state).ticks) {
        __assert_fail("APU.sync_ticks == TICKS",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                      ,0xf64,"void apu_synchronize(Emulator *)");
      }
    }
  }
  return;
}

Assistant:

static void apu_synchronize(Emulator* e) {
  if (TICKS > APU.sync_ticks) {
    u32 ticks = TICKS - APU.sync_ticks;
    if (APU.enabled) {
      apu_update(e, ticks);
      assert(APU.sync_ticks == TICKS);
    } else {
      for (; ticks; ticks -= APU_TICKS) {
        write_audio_frame(e, 1);
      }
      APU.sync_ticks = TICKS;
    }
  }
}